

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_88;
  
  if (radius <= 0.0) {
    iVar3 = (this->_Path).Size;
    if (iVar3 == (this->_Path).Capacity) {
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      iVar10 = iVar3 + 1;
      if (iVar3 + 1 < iVar9) {
        iVar10 = iVar9;
      }
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar10;
      iVar3 = (this->_Path).Size;
    }
    else {
      pIVar5 = (this->_Path).Data;
    }
    pIVar5[iVar3] = *center;
LAB_00201e6f:
    (this->_Path).Size = (this->_Path).Size + 1;
    return;
  }
  if (num_segments < 1) {
    if (radius <= this->_Data->ArcFastRadiusCutoff) {
      fVar11 = (a_min * 48.0) / 6.2831855;
      fVar15 = (a_max * 48.0) / 6.2831855;
      if (a_min <= a_max) {
        fVar11 = ceilf(fVar11);
        iVar3 = (int)fVar11;
        iVar10 = (int)(float)(int)((int)fVar15 -
                                  (uint)((float)(int)fVar15 != fVar15 && fVar15 < 0.0));
        iVar9 = iVar10 - iVar3;
      }
      else {
        iVar3 = (int)(float)(int)((int)fVar11 - (uint)((float)(int)fVar11 != fVar11 && fVar11 < 0.0)
                                 );
        fVar11 = ceilf(fVar15);
        iVar10 = (int)fVar11;
        iVar9 = iVar3 - iVar10;
      }
      iVar7 = 0;
      if (0 < iVar9) {
        iVar7 = iVar9;
      }
      fVar15 = ((float)iVar3 * 3.1415927 + (float)iVar3 * 3.1415927) / 48.0 - a_min;
      fVar11 = a_max - ((float)iVar10 * 3.1415927 + (float)iVar10 * 3.1415927) / 48.0;
      iVar7 = iVar7 + (this->_Path).Size + (uint)(fVar11 != 0.0) + (uint)(fVar15 != 0.0) + 1;
      if ((this->_Path).Capacity < iVar7) {
        pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          memcpy(pIVar4,pIVar5,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar4;
        (this->_Path).Capacity = iVar7;
      }
      if ((fVar15 != 0.0) || (NAN(fVar15))) {
        fVar15 = center->x;
        fVar12 = cosf(a_min);
        fVar14 = center->y;
        fVar13 = sinf(a_min);
        iVar7 = (this->_Path).Size;
        if (iVar7 == (this->_Path).Capacity) {
          if (iVar7 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar7 / 2 + iVar7;
          }
          iVar8 = iVar7 + 1;
          if (iVar7 + 1 < iVar6) {
            iVar8 = iVar6;
          }
          pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
          pIVar4 = (this->_Path).Data;
          if (pIVar4 != (ImVec2 *)0x0) {
            memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = pIVar5;
          (this->_Path).Capacity = iVar8;
          iVar7 = (this->_Path).Size;
        }
        else {
          pIVar5 = (this->_Path).Data;
        }
        IVar1.y = radius * fVar13 + fVar14;
        IVar1.x = radius * fVar12 + fVar15;
        pIVar5[iVar7] = IVar1;
        (this->_Path).Size = (this->_Path).Size + 1;
      }
      if (0 < iVar9) {
        _PathArcToFastEx(this,center,radius,iVar3,iVar10,0);
      }
      if ((fVar11 == 0.0) && (!NAN(fVar11))) {
        return;
      }
      fVar11 = center->x;
      fVar14 = cosf(a_max);
      fVar15 = center->y;
      fVar12 = sinf(a_max);
      iVar3 = (this->_Path).Size;
      if (iVar3 == (this->_Path).Capacity) {
        if (iVar3 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar3 / 2 + iVar3;
        }
        iVar10 = iVar3 + 1;
        if (iVar3 + 1 < iVar9) {
          iVar10 = iVar9;
        }
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
        pIVar4 = (this->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar10;
        iVar3 = (this->_Path).Size;
      }
      else {
        pIVar5 = (this->_Path).Data;
      }
      IVar2.y = radius * fVar12 + fVar15;
      IVar2.x = radius * fVar14 + fVar11;
      pIVar5[iVar3] = IVar2;
      goto LAB_00201e6f;
    }
    local_88 = ABS(a_max - a_min);
    iVar3 = _CalcCircleAutoSegmentCount(this,radius);
    fVar11 = ceilf(((float)iVar3 * local_88) / 6.2831855);
    num_segments = (int)(6.2831855 / local_88);
    if ((int)(6.2831855 / local_88) < (int)fVar11) {
      num_segments = (int)fVar11;
    }
  }
  _PathArcToN(this,center,radius,a_min,a_max,num_segments);
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloorSigned(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloorSigned(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = (a_min_segment_angle - a_min) != 0.0f;
        const bool a_emit_end = (a_max - a_max_segment_angle) != 0.0f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}